

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O0

int mbedtls_mpi_safe_cond_swap(mbedtls_mpi *X,mbedtls_mpi *Y,uchar swap)

{
  short sVar1;
  int iVar2;
  mbedtls_ct_condition_t nblimbs;
  undefined1 in_DL;
  mbedtls_mpi_uint *in_RSI;
  mbedtls_mpi_uint *in_RDI;
  mbedtls_ct_condition_t do_swap;
  int s;
  int ret;
  short in_stack_ffffffffffffffcc;
  short in_stack_ffffffffffffffce;
  mbedtls_ct_uint_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined3 in_stack_ffffffffffffffe4;
  undefined4 uVar3;
  int local_4;
  
  uVar3 = CONCAT13(in_DL,in_stack_ffffffffffffffe4);
  if (in_RDI == in_RSI) {
    local_4 = 0;
  }
  else {
    nblimbs = mbedtls_ct_bool(in_stack_ffffffffffffffd0);
    local_4 = mbedtls_mpi_grow((mbedtls_mpi *)
                               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),nblimbs
                              );
    if ((local_4 == 0) &&
       (local_4 = mbedtls_mpi_grow((mbedtls_mpi *)
                                   CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                                   nblimbs), local_4 == 0)) {
      iVar2 = (int)(short)in_RDI[1];
      sVar1 = mbedtls_ct_mpi_sign_if(nblimbs,in_stack_ffffffffffffffce,in_stack_ffffffffffffffcc);
      *(short *)(in_RDI + 1) = sVar1;
      sVar1 = mbedtls_ct_mpi_sign_if(nblimbs,in_stack_ffffffffffffffce,in_stack_ffffffffffffffcc);
      *(short *)(in_RSI + 1) = sVar1;
      mbedtls_mpi_core_cond_swap
                (in_RDI,in_RSI,CONCAT44(uVar3,local_4),CONCAT44(iVar2,in_stack_ffffffffffffffd8));
    }
  }
  return local_4;
}

Assistant:

int mbedtls_mpi_safe_cond_swap(mbedtls_mpi *X,
                               mbedtls_mpi *Y,
                               unsigned char swap)
{
    int ret = 0;
    int s;

    if (X == Y) {
        return 0;
    }

    mbedtls_ct_condition_t do_swap = mbedtls_ct_bool(swap);

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, Y->n));
    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(Y, X->n));

    s = X->s;
    X->s = mbedtls_ct_mpi_sign_if(do_swap, Y->s, X->s);
    Y->s = mbedtls_ct_mpi_sign_if(do_swap, s, Y->s);

    mbedtls_mpi_core_cond_swap(X->p, Y->p, X->n, do_swap);

cleanup:
    return ret;
}